

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void rtDataHandler(vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_> *rtData)

{
  ostream *poVar1;
  float *pfVar2;
  int j;
  int index;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rtDataHandler::i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] RT Data is ->  ",0x11);
  if ((rtData->super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>)._M_impl
      .super__Vector_impl_data._M_finish !=
      (rtData->super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>)._M_impl
      .super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ch ",3);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
        pfVar2 = SRI::RTData<float>::operator[]
                           ((rtData->
                            super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar3,index);
        poVar1 = std::ostream::_M_insert<double>((double)*pfVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
        index = index + 1;
      } while (index != 6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(rtData->
                                   super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(rtData->
                                   super__Vector_base<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  rtDataHandler::i = rtDataHandler::i + 1;
  return;
}

Assistant:

void rtDataHandler(std::vector<RTData<float>>& rtData) {
    static int i = 0;
    std::cout << "[" << i << "] RT Data is ->  ";
    for(int i = 0; i < rtData.size(); i++) {
        for(int j = 0; j < 6; j++) {
            std::cout << "Ch " << j << ": " << rtData[i][j] << "\t";
        }
        std::cout << std::endl;
    }
    i++;
}